

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

Min_Cube_t * Min_CubesXor(Min_Man_t *p,Min_Cube_t *pCube0,Min_Cube_t *pCube1)

{
  int iVar1;
  Min_Cube_t *pCube_00;
  int local_2c;
  int i;
  Min_Cube_t *pCube;
  Min_Cube_t *pCube1_local;
  Min_Cube_t *pCube0_local;
  Min_Man_t *p_local;
  
  if ((*(uint *)&pCube0->field_0x8 & 0x3ff) == (*(uint *)&pCube1->field_0x8 & 0x3ff)) {
    pCube_00 = Min_CubeAlloc(p);
    for (local_2c = 0; local_2c < p->nWords; local_2c = local_2c + 1) {
      pCube_00->uData[local_2c] = pCube0->uData[local_2c] ^ pCube1->uData[local_2c];
    }
    iVar1 = Min_CubeCountLits(pCube_00);
    *(uint *)&pCube_00->field_0x8 = *(uint *)&pCube_00->field_0x8 & 0x3fffff | iVar1 << 0x16;
    return pCube_00;
  }
  __assert_fail("pCube0->nVars == pCube1->nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covInt.h"
                ,0x1e3,"Min_Cube_t *Min_CubesXor(Min_Man_t *, Min_Cube_t *, Min_Cube_t *)");
}

Assistant:

static inline Min_Cube_t * Min_CubesXor( Min_Man_t * p, Min_Cube_t * pCube0, Min_Cube_t * pCube1 )
{
    Min_Cube_t * pCube;
    int i;
    assert( pCube0->nVars == pCube1->nVars );
    pCube = Min_CubeAlloc( p );
    for ( i = 0; i < p->nWords; i++ )
        pCube->uData[i] = pCube0->uData[i] ^ pCube1->uData[i];
    pCube->nLits = Min_CubeCountLits( pCube );
    return pCube;
}